

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void __thiscall
TCLAP::Arg::Arg(Arg *this,string *flag,string *name,string *desc,bool req,bool valreq,Visitor *v)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  long *in_RDI;
  byte in_R8B;
  byte in_R9B;
  long in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  bool local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  allocator<char> *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  bool bVar6;
  undefined1 uVar7;
  undefined1 local_390 [48];
  string *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  SpecificationException *in_stack_fffffffffffffcb0;
  string local_2a8 [38];
  byte local_282;
  byte local_281;
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [39];
  undefined1 local_1d9;
  undefined1 local_1d8 [231];
  byte local_f1;
  string local_f0 [39];
  byte local_c9;
  string local_c8 [32];
  string local_a8 [39];
  undefined1 local_81;
  undefined1 local_80 [75];
  allocator<char> local_35 [19];
  byte local_22;
  byte local_21;
  string *local_20;
  string *local_18;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  *in_RDI = (long)&PTR__Arg_00158718;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 5),local_18);
  std::__cxx11::string::string((string *)(in_RDI + 9),local_20);
  *(byte *)(in_RDI + 0xd) = local_21 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,
             (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
             in_stack_fffffffffffffbe0);
  std::allocator<char>::~allocator(local_35);
  *(byte *)(in_RDI + 0x12) = local_22 & 1;
  *(undefined1 *)((long)in_RDI + 0x91) = 0;
  in_RDI[0x13] = in_stack_00000008;
  *(undefined1 *)(in_RDI + 0x14) = 1;
  *(undefined1 *)((long)in_RDI + 0xa1) = 0;
  *(undefined1 *)((long)in_RDI + 0xa2) = 0;
  uVar3 = std::__cxx11::string::length();
  if (1 < uVar3) {
    local_81 = 1;
    uVar4 = __cxa_allocate_exception(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,
               (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
    (**(code **)(*in_RDI + 0x38))(local_80);
    SpecificationException::SpecificationException
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    local_81 = 0;
    __cxa_throw(uVar4,&SpecificationException::typeinfo,
                SpecificationException::~SpecificationException);
  }
  local_c9 = 0;
  local_f1 = 0;
  ignoreNameString_abi_cxx11_();
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                          in_stack_fffffffffffffba8);
  bVar6 = false;
  if (bVar1) {
    in_stack_fffffffffffffbf0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 1);
    flagStartString_abi_cxx11_();
    local_c9 = 1;
    _Var2 = std::operator==(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    bVar6 = true;
    if (!_Var2) {
      nameStartString_abi_cxx11_();
      local_f1 = 1;
      _Var2 = std::operator==(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      bVar6 = true;
      if (!_Var2) {
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                                (char *)in_stack_fffffffffffffba8);
      }
    }
  }
  uVar7 = bVar6;
  if ((local_f1 & 1) != 0) {
    std::__cxx11::string::~string(local_f0);
  }
  if ((local_c9 & 1) != 0) {
    std::__cxx11::string::~string(local_c8);
  }
  std::__cxx11::string::~string(local_a8);
  if (bVar6 != false) {
    local_1d9 = 1;
    uVar4 = __cxa_allocate_exception(0x68);
    flagStartString_abi_cxx11_();
    std::operator+((char *)CONCAT17(uVar7,in_stack_fffffffffffffbf8),in_stack_fffffffffffffbf0);
    std::operator+(in_stack_fffffffffffffbb8,
                   (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    nameStartString_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffbb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    std::operator+(in_stack_fffffffffffffbb8,
                   (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    (**(code **)(*in_RDI + 0x38))(local_1d8);
    SpecificationException::SpecificationException
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    local_1d9 = 0;
    __cxa_throw(uVar4,&SpecificationException::typeinfo,
                SpecificationException::~SpecificationException);
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 5);
  local_281 = 0;
  local_282 = 0;
  bVar1 = false;
  flagStartString_abi_cxx11_();
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_200,(ulong)__rhs);
  flagStartString_abi_cxx11_();
  _Var2 = std::operator==(in_stack_fffffffffffffbd0,__rhs);
  local_439 = true;
  if (!_Var2) {
    in_stack_fffffffffffffbb8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 5);
    nameStartString_abi_cxx11_();
    local_281 = 1;
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_260,(ulong)in_stack_fffffffffffffbb8);
    local_282 = 1;
    nameStartString_abi_cxx11_();
    bVar1 = true;
    _Var2 = std::operator==(in_stack_fffffffffffffbd0,__rhs);
    local_439 = true;
    if (!_Var2) {
      lVar5 = std::__cxx11::string::find((char *)(in_RDI + 5),0x14a755);
      local_439 = lVar5 != -1;
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_2a8);
  }
  if ((local_282 & 1) != 0) {
    std::__cxx11::string::~string(local_260);
  }
  if ((local_281 & 1) != 0) {
    std::__cxx11::string::~string(local_280);
  }
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_220);
  if ((local_439 & 1U) != 0) {
    uVar4 = __cxa_allocate_exception(0x68);
    flagStartString_abi_cxx11_();
    std::operator+((char *)CONCAT17(uVar7,in_stack_fffffffffffffbf8),in_stack_fffffffffffffbf0);
    std::operator+(in_stack_fffffffffffffbb8,(char *)CONCAT17(local_439,in_stack_fffffffffffffbb0));
    nameStartString_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffbb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(local_439,in_stack_fffffffffffffbb0));
    std::operator+(in_stack_fffffffffffffbb8,(char *)CONCAT17(local_439,in_stack_fffffffffffffbb0));
    (**(code **)(*in_RDI + 0x38))(local_390);
    SpecificationException::SpecificationException
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    __cxa_throw(uVar4,&SpecificationException::typeinfo,
                SpecificationException::~SpecificationException);
  }
  return;
}

Assistant:

inline Arg::Arg(const std::string& flag,
         const std::string& name,
         const std::string& desc,
         bool req,
         bool valreq,
         Visitor* v) :
  _flag(flag),
  _name(name),
  _description(desc),
  _required(req),
  _requireLabel("required"),
  _valueRequired(valreq),
  _alreadySet(false),
  _visitor( v ),
  _ignoreable(true),
  _xorSet(false),
  _acceptsMultipleValues(false)
{
	if ( _flag.length() > 1 )
		throw(SpecificationException(
				"Argument flag can only be one character long", toString() ) );

	if ( _name != ignoreNameString() &&
		 ( _flag == Arg::flagStartString() ||
		   _flag == Arg::nameStartString() ||
		   _flag == " " ) )
		throw(SpecificationException("Argument flag cannot be either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or a space.",
							toString() ) );

	if ( ( _name.substr( 0, Arg::flagStartString().length() ) == Arg::flagStartString() ) ||
		 ( _name.substr( 0, Arg::nameStartString().length() ) == Arg::nameStartString() ) ||
		 ( _name.find( " ", 0 ) != std::string::npos ) )
		throw(SpecificationException("Argument name begin with either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or space.",
							toString() ) );

}